

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O2

void __thiscall
GdlRuleTable::CheckTablesAndPasses
          (GdlRuleTable *this,GrcManager *pcman,int *pnPassNum,int *pipassBidi)

{
  int iVar1;
  uint uVar2;
  uint __val;
  pointer ppGVar3;
  GdlPass *pGVar4;
  GdlRenderer *pGVar5;
  string sta4;
  string *staMsg;
  uint __val_00;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 in_stack_fffffffffffffd98;
  string staPass;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ppGVar3 = (this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((8 < (ulong)((long)(this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar3)) &&
     (pGVar4 = *ppGVar3,
     *(pointer *)
      ((long)&(pGVar4->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl +
      8) != (pGVar4->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
            super__Vector_impl_data._M_start)) {
    GrcSymbolTableEntry::FullName_abi_cxx11_(&local_1f0,this->m_psymName);
    std::__cxx11::string::string
              ((string *)&local_210,
               " table is multi-pass, so all rules must be explicitly placed in a pass",
               (allocator *)&staPass);
    GrcErrorList::AddError(&g_errorList,0xc1e,&this->super_GdlObject,&local_1f0,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  __val_00 = 0;
  do {
    uVar6 = (ulong)__val_00;
    if ((ulong)((long)(this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar6) {
      return;
    }
    std::__cxx11::to_string(&staPass,__val_00);
    pGVar4 = (this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6];
    if ((*(pointer *)
          ((long)&(pGVar4->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>.
                  _M_impl + 8) ==
         (pGVar4->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
         super__Vector_impl_data._M_start) && (pGVar4->m_nCollisionFix < 1)) {
      if (uVar6 == 0) {
        pGVar4->m_nGlobalID = -1;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_190,"Pass ",(allocator *)&stack0xfffffffffffffd9d);
        std::__cxx11::string::string((string *)&local_230,(string *)&staPass);
        std::__cxx11::string::string
                  ((string *)&local_1b0," of ",(allocator *)&stack0xfffffffffffffd9e);
        GrcSymbolTableEntry::FullName_abi_cxx11_(&local_1d0,this->m_psymName);
        std::__cxx11::string::string
                  ((string *)&local_b0," table contains no rules",
                   (allocator *)&stack0xfffffffffffffd9f);
        GrcErrorList::AddWarning
                  (&g_errorList,0xdaf,&this->super_GdlObject,&local_190,&local_230,&local_1b0,
                   &local_1d0,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_190);
        (this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6]->m_nGlobalID = -1;
      }
    }
    else {
      iVar1 = *pnPassNum;
      pGVar4->m_nGlobalID = iVar1;
      *pnPassNum = iVar1 + 1;
      uVar2 = pGVar4->m_nDir;
      if (uVar2 < 3) {
        pGVar5 = pcman->m_prndr;
        __val = pGVar5->m_grfsdc;
        if ((uVar2 == 0) || (0xfffffffd < __val - 3)) {
          if (__val == uVar2 && uVar2 != 0) {
            std::__cxx11::string::string
                      ((string *)&local_150,"Direction of pass ",
                       (allocator *)&stack0xfffffffffffffd9d);
            std::__cxx11::string::string((string *)&local_170,(string *)&staPass);
            std::__cxx11::string::string
                      ((string *)&local_90,
                       " matches font\'s ScriptDirection and will have no effect ",
                       (allocator *)&stack0xfffffffffffffd9e);
            staMsg = &local_150;
            GrcErrorList::AddWarning
                      (&g_errorList,0xdd3,&this->super_GdlObject,staMsg,&local_170,&local_90);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_170);
            goto LAB_00128ed2;
          }
          if (uVar2 != 0) {
            pGVar4->m_fFlipDir = true;
            pGVar5->m_fHasFlippedPass = 1;
          }
        }
        else {
          std::__cxx11::string::string
                    ((string *)&local_f0,"Direction directive invalid (on pass ",
                     (allocator *)&stack0xfffffffffffffd9d);
          std::__cxx11::string::string((string *)&local_110,(string *)&staPass);
          std::__cxx11::string::string
                    ((string *)&local_130,") due to font ScriptDirection setting of ",
                     (allocator *)&stack0xfffffffffffffd9e);
          uVar7 = 0x128f5b;
          std::__cxx11::to_string(&local_70,__val);
          sta4._M_string_length = uVar7;
          sta4._M_dataplus._M_p = (pointer)&local_70;
          sta4.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
          sta4.field_2._8_8_ = pcman;
          GrcErrorList::AddError
                    (&g_errorList,0xc5f,&this->super_GdlObject,&local_f0,&local_110,&local_130,sta4)
          ;
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_f0);
        }
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_d0,"Invalid direction for pass ",
                   (allocator *)&stack0xfffffffffffffd9d);
        std::__cxx11::string::string((string *)&local_50,(string *)&staPass);
        staMsg = &local_d0;
        GrcErrorList::AddError(&g_errorList,0xc5e,&this->super_GdlObject,staMsg,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
LAB_00128ed2:
        std::__cxx11::string::~string((string *)staMsg);
      }
    }
    std::__cxx11::string::~string((string *)&staPass);
    __val_00 = __val_00 + 1;
  } while( true );
}

Assistant:

void GdlRuleTable::CheckTablesAndPasses(GrcManager * pcman, int *pnPassNum, int *pipassBidi)
{
	if (m_vppass.size() > 1 && m_vppass[0]->HasRules())
	{
		g_errorList.AddError(3102, this,
			m_psymName->FullName(),
			" table is multi-pass, so all rules must be explicitly placed in a pass");

		// but go ahead and treat it as the zeroth pass for now
	}

	for (auto ipass = 0U; ipass < m_vppass.size(); ++ipass)
	{
		auto const staPass = std::to_string(ipass);
		if (m_vppass[ipass]->ValidPass())
		{
			m_vppass[ipass]->AssignGlobalID(*pnPassNum);
			(*pnPassNum)++;

			int fsdcPassDir = m_vppass[ipass]->Direction();
			int fsdcScriptDir = pcman->Renderer()->ScriptDirections();
			if (fsdcPassDir != kfsdcNone && fsdcPassDir != kfsdcHorizLtr && fsdcPassDir != kfsdcHorizRtl)
			{
				g_errorList.AddError(3166, this,
					"Invalid direction for pass ",
					staPass);
			}
			else if (fsdcPassDir != kfsdcNone && fsdcScriptDir != kfsdcHorizLtr && fsdcScriptDir != kfsdcHorizRtl)
			{
				g_errorList.AddError(3167, this,
					"Direction directive invalid (on pass ",
					staPass,
					") due to font ScriptDirection setting of ",
					std::to_string(fsdcScriptDir));
			}
			else if (fsdcPassDir != kfsdcNone && fsdcScriptDir == fsdcPassDir)
			{
				g_errorList.AddWarning(3539, this,
					"Direction of pass ",
					staPass,
					" matches font's ScriptDirection and will have no effect ");
			}
			else
			{
				Assert(fsdcScriptDir >= kfsdcNone);
				Assert(fsdcScriptDir <= kfsdcHorizRtl);
				if (fsdcPassDir > kfsdcNone)
				{
					Assert(fsdcScriptDir != fsdcPassDir);
					m_vppass[ipass]->SetFlipDirection(true);
					pcman->Renderer()->SetHasFlippedPass(true);
				}
			}
		}
		else if (ipass == 0)
		{
			// okay--zeroth pass *should* be empty if there are other passes
			m_vppass[ipass]->AssignGlobalID(-1);
		}
		else
		{
			g_errorList.AddWarning(3503, this,
				"Pass ",
				staPass,
				" of ",
				m_psymName->FullName(),
				" table contains no rules");
			m_vppass[ipass]->AssignGlobalID(-1);
		}
	}
}